

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

string * __thiscall
PacketProcessor::GetFamilyName_abi_cxx11_
          (string *__return_storage_ptr__,PacketProcessor *this,PacketFamily family)

{
  string *psVar1;
  undefined7 in_register_00000011;
  PacketFamily family_local;
  
  psVar1 = (string *)
           (*(code *)(&DAT_00252044 + *(int *)(&DAT_00252044 + ((ulong)this & 0xff) * 4)))
                     (__return_storage_ptr__,this,CONCAT71(in_register_00000011,family));
  return psVar1;
}

Assistant:

std::string PacketProcessor::GetFamilyName(PacketFamily family)
{
	switch (family)
	{
		case PACKET_INTERNAL: return "INTERNAL";
		case PACKET_CONNECTION: return "Connection";
		case PACKET_ACCOUNT: return "Account";
		case PACKET_CHARACTER: return "Character";
		case PACKET_LOGIN: return "Login";
		case PACKET_WELCOME: return "Welcome";
		case PACKET_WALK: return "Walk";
		case PACKET_FACE: return "Face";
		case PACKET_CHAIR: return "Chair";
		case PACKET_EMOTE: return "Emote";
		case PACKET_ATTACK: return "Attack";
		case PACKET_SPELL: return "Spell";
		case PACKET_SHOP: return "Shop";
		case PACKET_ITEM: return "Item";
		case PACKET_STATSKILL: return "StatSkill";
		case PACKET_GLOBAL: return "Global";
		case PACKET_TALK: return "Talk";
		case PACKET_WARP: return "Warp";
		case PACKET_JUKEBOX: return "Jukebox";
		case PACKET_PLAYERS: return "Players";
		case PACKET_AVATAR: return "Avatar";
		case PACKET_PARTY: return "Party";
		case PACKET_REFRESH: return "Refresh";
		case PACKET_NPC: return "NPC";
		case PACKET_PLAYER_RANGE: return "Player_Range";
		case PACKET_NPC_RANGE: return "NPC_Range";
		case PACKET_RANGE: return "Range";
		case PACKET_PAPERDOLL: return "Paperdoll";
		case PACKET_EFFECT: return "Effect";
		case PACKET_TRADE: return "Trade";
		case PACKET_CHEST: return "Chest";
		case PACKET_DOOR: return "Door";
		case PACKET_MESSAGE: return "Message";
		case PACKET_BANK: return "Bank";
		case PACKET_LOCKER: return "Locker";
		case PACKET_BARBER: return "Barber";
		case PACKET_GUILD: return "Guild";
		case PACKET_MUSIC: return "Music";
		case PACKET_SIT: return "Sit";
		case PACKET_RECOVER: return "Recover";
		case PACKET_BOARD: return "Board";
		case PACKET_CAST: return "Cast";
		case PACKET_ARENA: return "Arena";
		case PACKET_PRIEST: return "Priest";
		case PACKET_MARRIAGE: return "Marriage";
		case PACKET_ADMININTERACT: return "AdminInteract";
		case PACKET_CITIZEN: return "Citizen";
		case PACKET_QUEST: return "Quest";
		case PACKET_BOOK: return "Book";
		case PACKET_F_INIT: return "Init";
		default: return "UNKNOWN";
	}
}